

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O0

int deflateTune(z_streamp strm,int good_length,int max_lazy,int nice_length,int max_chain)

{
  internal_state *piVar1;
  deflate_state *s;
  int max_chain_local;
  int nice_length_local;
  int max_lazy_local;
  int good_length_local;
  z_streamp strm_local;
  
  if ((strm == (z_streamp)0x0) || (strm->state == (internal_state *)0x0)) {
    strm_local._4_4_ = -2;
  }
  else {
    piVar1 = strm->state;
    piVar1->good_match = good_length;
    piVar1->max_lazy_match = max_lazy;
    piVar1->nice_match = nice_length;
    piVar1->max_chain_length = max_chain;
    strm_local._4_4_ = 0;
  }
  return strm_local._4_4_;
}

Assistant:

int ZEXPORT deflateTune(strm, good_length, max_lazy, nice_length, max_chain)
    z_streamp strm;
    int good_length;
    int max_lazy;
    int nice_length;
    int max_chain;
{
    deflate_state *s;

    if (strm == Z_NULL || strm->state == Z_NULL) return Z_STREAM_ERROR;
    s = strm->state;
    s->good_match = good_length;
    s->max_lazy_match = max_lazy;
    s->nice_match = nice_length;
    s->max_chain_length = max_chain;
    return Z_OK;
}